

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O3

char * stumpless_get_element_name(stumpless_element *element)

{
  char *__dest;
  
  if (element == (stumpless_element *)0x0) {
    raise_argument_empty("element was NULL");
    __dest = (char *)0x0;
  }
  else {
    pthread_lock_mutex((pthread_mutex_t *)element->mutex);
    __dest = (char *)alloc_mem(element->name_length + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,element,element->name_length + 1);
      clear_error();
    }
    pthread_unlock_mutex((pthread_mutex_t *)element->mutex);
  }
  return __dest;
}

Assistant:

const char *
stumpless_get_element_name( const struct stumpless_element *element ) {
  char *name_copy;

  VALIDATE_ARG_NOT_NULL( element );

  lock_element( element );
  name_copy = alloc_mem( element->name_length + 1 );
  if( !name_copy ) {
    goto cleanup_and_return;
  }
  memcpy( name_copy, element->name, element->name_length + 1 );
  clear_error(  );

cleanup_and_return:
  unlock_element( element );
  return name_copy;
}